

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FieldDescriptor::GetSourceLocation
          (FieldDescriptor *this,SourceLocation *out_location)

{
  bool bVar1;
  FileDescriptor *this_00;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> path;
  SourceLocation *out_location_local;
  FieldDescriptor *this_local;
  
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &out_location->start_line;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_30);
  GetLocationPath(this,(vector<int,_std::allocator<int>_> *)local_30);
  this_00 = file(this);
  bVar1 = FileDescriptor::GetSourceLocation
                    (this_00,(vector<int,_std::allocator<int>_> *)local_30,
                     (SourceLocation *)
                     path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return bVar1;
}

Assistant:

bool FieldDescriptor::GetSourceLocation(SourceLocation* out_location) const {
  std::vector<int> path;
  GetLocationPath(&path);
  return file()->GetSourceLocation(path, out_location);
}